

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

formattible_type __thiscall
booster::locale::basic_format<char>::get(basic_format<char> *this,uint id)

{
  const_reference other;
  uint in_EDX;
  writer_type extraout_RDX;
  writer_type extraout_RDX_00;
  writer_type extraout_RDX_01;
  writer_type p_Var1;
  long in_RSI;
  formattible<char> *in_RDI;
  formattible_type fVar2;
  
  if (in_EDX < *(uint *)(in_RSI + 0x128)) {
    if (in_EDX < 8) {
      details::formattible<char>::formattible
                (in_RDI,(formattible<char> *)(in_RSI + 0xa8 + (ulong)in_EDX * 0x10));
      p_Var1 = extraout_RDX_01;
    }
    else {
      other = std::
              vector<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
              ::operator[]((vector<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
                            *)(in_RSI + 0x130),(ulong)(in_EDX - 8));
      details::formattible<char>::formattible(in_RDI,other);
      p_Var1 = extraout_RDX_00;
    }
  }
  else {
    details::formattible<char>::formattible(in_RDI);
    p_Var1 = extraout_RDX;
  }
  fVar2.writer_ = p_Var1;
  fVar2.pointer_ = in_RDI;
  return fVar2;
}

Assistant:

formattible_type get(unsigned id) const
            {
                if(id >= parameters_count_)
                    return formattible_type();
                else if(id >= base_params_)
                    return ext_params_[id - base_params_];
                else
                    return parameters_[id];
            }